

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bidi_test.c
# Opt level: O2

void run_test(char *filename,uint lineno,bidi_char *bcs,size_t bcs_len,uint *order,size_t order_len,
             int override)

{
  byte bVar1;
  void *__dest;
  size_t sVar2;
  void *ptr;
  char *pcVar3;
  char *pcVar4;
  size_t i_1;
  unsigned_short *puVar5;
  uint *puVar6;
  wchar_t *pwVar7;
  size_t sVar8;
  bool bVar9;
  
  __dest = safemalloc(bcs_len,0xc,0);
  if (bcs_len != 0) {
    memcpy(__dest,bcs,bcs_len * 0xc);
  }
  sVar2 = do_bidi_test(ctx,bcs,bcs_len,override);
  sVar8 = 0;
  ptr = safemalloc(sVar2,4,0);
  puVar5 = &bcs->index;
  while (bVar9 = sVar2 != 0, sVar2 = sVar2 - 1, bVar9) {
    bVar1 = bidi_getType(*(wchar_t *)(puVar5 + -2));
    if ((0x402c6U >> (bVar1 & 0x1f) & 1) == 0) {
      *(uint *)((long)ptr + sVar8 * 4) = (uint)*puVar5;
      sVar8 = sVar8 + 1;
    }
    puVar5 = puVar5 + 6;
  }
  if (sVar8 == order_len) {
    bVar9 = true;
    for (sVar2 = 0; order_len != sVar2; sVar2 = sVar2 + 1) {
      bVar9 = (bool)(bVar9 & *(uint *)((long)ptr + sVar2 * 4) == order[sVar2]);
    }
    if (bVar9) {
      pass = pass + 1;
      goto LAB_00101d2a;
    }
  }
  fail = fail + 1;
  printf("%s:%u: failed order\n",filename,(ulong)lineno);
  printf("  input chars:");
  puVar6 = (uint *)((long)__dest + 4);
  sVar2 = bcs_len;
  while (bVar9 = sVar2 != 0, sVar2 = sVar2 - 1, bVar9) {
    printf(" %04x",(ulong)*puVar6);
    puVar6 = puVar6 + 3;
  }
  putchar(10);
  printf("  classes:    ");
  pwVar7 = (wchar_t *)((long)__dest + 4);
  sVar2 = bcs_len;
  while (bVar9 = sVar2 != 0, sVar2 = sVar2 - 1, bVar9) {
    bVar1 = bidi_getType(*pwVar7);
    printf(" %-4s",typenames[bVar1]);
    pwVar7 = pwVar7 + 3;
  }
  putchar(10);
  pcVar3 = "RTL";
  if (override == 0) {
    pcVar3 = "auto";
  }
  pcVar4 = "LTR";
  if (override < 1) {
    pcVar4 = pcVar3;
  }
  printf("  para level = %s\n",pcVar4);
  printf("  expected:");
  for (sVar2 = 0; order_len != sVar2; sVar2 = sVar2 + 1) {
    printf(" %u",(ulong)order[sVar2]);
  }
  putchar(10);
  printf("  got:     ");
  for (sVar2 = 0; sVar8 != sVar2; sVar2 = sVar2 + 1) {
    printf(" %u",(ulong)*(uint *)((long)ptr + sVar2 * 4));
  }
  putchar(10);
LAB_00101d2a:
  memcpy(bcs,__dest,bcs_len * 0xc);
  safefree(__dest);
  safefree(ptr);
  return;
}

Assistant:

static void run_test(const char *filename, unsigned lineno,
                     bidi_char *bcs, size_t bcs_len,
                     const unsigned *order, size_t order_len,
                     int override)
{
    size_t bcs_orig_len = bcs_len;
    bidi_char *bcs_orig = snewn(bcs_orig_len, bidi_char);
    if (bcs_orig_len)
        memcpy(bcs_orig, bcs, bcs_orig_len * sizeof(bidi_char));

    bcs_len = do_bidi_test(ctx, bcs, bcs_len, override);

    /*
     * TR9 revision 44 rule X9 says we remove explicit embedding
     * controls and BN characters. So the test cases don't list them
     * in the expected outputs. Do the same to our own output - unless
     * we're testing the standard version of the algorithm, in which
     * case, we expect the output to be exactly as the test cases say.
     */
    unsigned *our_order = snewn(bcs_len, unsigned);
    size_t our_order_len = 0;
    for (size_t i = 0; i < bcs_len; i++) {
        BidiType t = bidi_getType(bcs[i].wc);
#ifndef REMOVE_FORMATTING_CHARS
        if (typeIsRemovedDuringProcessing(t))
            continue;
#endif
        our_order[our_order_len++] = bcs[i].index;
    }

    bool ok = false;
    if (our_order_len == order_len) {
        ok = true;
        for (size_t i = 0; i < our_order_len; i++)
            if (our_order[i] != order[i])
                ok = false;
    }
    if (ok) {
        pass++;
    } else {
        fail++;
        printf("%s:%u: failed order\n", filename, lineno);
        printf("  input chars:");
        for (size_t i = 0; i < bcs_orig_len; i++)
            printf(" %04x", bcs_orig[i].wc);
        printf("\n");
        printf("  classes:    ");
        for (size_t i = 0; i < bcs_orig_len; i++)
            printf(" %-4s", typenames[bidi_getType(bcs_orig[i].wc)]);
        printf("\n");
        printf("  para level = %s\n",
               override > 0 ? "LTR" : override < 0 ? "RTL" : "auto");
        printf("  expected:");
        for (size_t i = 0; i < order_len; i++)
            printf(" %u", order[i]);
        printf("\n");
        printf("  got:     ");
        for (size_t i = 0; i < our_order_len; i++)
            printf(" %u", our_order[i]);
        printf("\n");
    }

    /* Put the original data back so we can re-test with another override */
    memcpy(bcs, bcs_orig, bcs_orig_len * sizeof(bidi_char));

    sfree(bcs_orig);
    sfree(our_order);
}